

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O0

TestStatus *
vkt::api::anon_unknown_1::
multithreadedCreateSharedResourcesTest<vkt::api::(anonymous_namespace)::ShaderModule>
          (TestStatus *__return_storage_ptr__,Context *context,Parameters *params)

{
  deUint32 maxResourceConsumers_;
  CreateThread<vkt::api::(anonymous_namespace)::ShaderModule> *this;
  DefaultDeleter<vkt::api::(anonymous_namespace)::ThreadGroupThread> local_bd [13];
  MovePtr<vkt::api::(anonymous_namespace)::ThreadGroupThread,_de::DefaultDeleter<vkt::api::(anonymous_namespace)::ThreadGroupThread>_>
  local_b0;
  uint local_9c;
  undefined1 local_98 [4];
  deUint32 ndx;
  ThreadGroup threads;
  Resources res;
  Environment env;
  deUint32 numThreads;
  Parameters *params_local;
  Context *context_local;
  
  maxResourceConsumers_ = getDefaultTestThreadCount();
  Environment::Environment((Environment *)&res,context,maxResourceConsumers_);
  ShaderModule::Resources::Resources
            ((Resources *)&threads.m_barrier.m_numRemoved,(Environment *)&res,params);
  ThreadGroup::ThreadGroup((ThreadGroup *)local_98);
  for (local_9c = 0; local_9c < maxResourceConsumers_; local_9c = local_9c + 1) {
    this = (CreateThread<vkt::api::(anonymous_namespace)::ShaderModule> *)operator_new(0x88);
    CreateThread<vkt::api::(anonymous_namespace)::ShaderModule>::CreateThread
              (this,(Environment *)&res,(Resources *)&threads.m_barrier.m_numRemoved,params);
    de::DefaultDeleter<vkt::api::(anonymous_namespace)::ThreadGroupThread>::DefaultDeleter(local_bd)
    ;
    de::details::
    MovePtr<vkt::api::(anonymous_namespace)::ThreadGroupThread,_de::DefaultDeleter<vkt::api::(anonymous_namespace)::ThreadGroupThread>_>
    ::MovePtr(&local_b0,this);
    ThreadGroup::add((ThreadGroup *)local_98,&local_b0);
    de::details::
    MovePtr<vkt::api::(anonymous_namespace)::ThreadGroupThread,_de::DefaultDeleter<vkt::api::(anonymous_namespace)::ThreadGroupThread>_>
    ::~MovePtr(&local_b0);
  }
  ThreadGroup::run(__return_storage_ptr__,(ThreadGroup *)local_98);
  ThreadGroup::~ThreadGroup((ThreadGroup *)local_98);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus multithreadedCreateSharedResourcesTest (Context& context, typename Object::Parameters params)
{
	const deUint32						numThreads	= getDefaultTestThreadCount();
	const Environment					env			(context, numThreads);
	const typename Object::Resources	res			(env, params);
	ThreadGroup							threads;

	for (deUint32 ndx = 0; ndx < numThreads; ndx++)
		threads.add(MovePtr<ThreadGroupThread>(new CreateThread<Object>(env, res, params)));

	return threads.run();
}